

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O0

string * __thiscall
soul::CompileMessage::getAnnotatedSourceLine_abi_cxx11_
          (string *__return_storage_ptr__,CompileMessage *this)

{
  char *pcVar1;
  LineAndColumn LVar2;
  char cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ulong local_68;
  size_t i;
  string indent;
  string sourceLine;
  LineAndColumn lc;
  CompileMessage *this_local;
  
  pcVar1 = UTF8Reader::getAddress(&(this->location).location);
  if (pcVar1 != (char *)0x0) {
    LVar2 = CodeLocation::getLineAndColumn(&this->location);
    sourceLine.field_2._12_4_ = LVar2.column;
    if (sourceLine.field_2._12_4_ != 0) {
      CodeLocation::getSourceLine_abi_cxx11_((string *)((long)&indent.field_2 + 8),&this->location);
      std::__cxx11::string::string((string *)&i);
      for (local_68 = 0; local_68 < sourceLine.field_2._12_4_ - 1; local_68 = local_68 + 1) {
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)((long)&indent.field_2 + 8));
        cVar3 = ' ';
        if (*pcVar1 == '\t') {
          cVar3 = '\t';
        }
        std::__cxx11::string::operator+=((string *)&i,cVar3);
      }
      std::operator+(&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&indent.field_2 + 8),"\n");
      std::operator+(&local_98,&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
      std::operator+(__return_storage_ptr__,&local_98,"^");
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&i);
      std::__cxx11::string::~string((string *)(indent.field_2._M_local_buf + 8));
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string CompileMessage::getAnnotatedSourceLine() const
{
    if (location.location.getAddress() != nullptr)
    {
        auto lc = location.getLineAndColumn();

        if (lc.column != 0)
        {
            auto sourceLine = location.getSourceLine();
            std::string indent;

            // because some fools insist on using tab characters, we need to make sure we mirror
            // any tabs in the original source line when indenting the '^' character, so that when
            // it's printed underneath it lines-up regardless of tab size
            for (size_t i = 0; i < lc.column - 1; ++i)
                indent += sourceLine[i] == '\t' ? '\t' : ' ';

            return sourceLine + "\n" + indent + "^";
        }
    }

    return {};
}